

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

int VP8LHashChainFill(VP8LHashChain *p,int quality,uint32_t *argb,int xsize,int ysize,int low_effort
                     )

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *__s;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint32_t uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint32_t uVar21;
  bool bVar22;
  ulong uVar13;
  
  iVar19 = ysize * xsize;
  uVar3 = 0xfff88;
  if (quality < 0x4c) {
    if (quality < 0x33) {
      uVar3 = xsize << ((0x19 < quality) * '\x02' | 4U);
    }
    else {
      uVar3 = xsize << 8;
    }
  }
  uVar7 = 0xfff88;
  if ((int)uVar3 < 0xfff88) {
    uVar7 = uVar3;
  }
  puVar1 = p->offset_length_;
  if (iVar19 < 3) {
    puVar1[(long)iVar19 + -1] = 0;
    *puVar1 = 0;
  }
  else {
    __s = WebPSafeMalloc(0x40000,4);
    if (__s == (void *)0x0) {
      return 0;
    }
    uVar3 = (uint)(quality * quality) >> 7;
    iVar4 = uVar3 + 8;
    memset(__s,0xff,0x100000);
    uVar12 = iVar19 - 2;
    uVar13 = (ulong)uVar12;
    bVar22 = *argb == argb[1];
    uVar11 = 0;
    do {
      iVar6 = (int)uVar11;
      if ((bVar22) && (argb[(long)iVar6 + 1] == argb[(long)iVar6 + 2])) {
        uVar21 = argb[iVar6];
        uVar18 = 1;
        if (iVar6 + 3 < iVar19) {
          uVar18 = uVar12 - iVar6;
          iVar5 = 3;
          do {
            if (argb[(uint)(iVar5 + iVar6)] != uVar21) {
              uVar18 = iVar5 - 2;
              break;
            }
            iVar5 = iVar5 + 1;
          } while ((iVar6 - iVar19) + iVar5 != 0);
        }
        uVar8 = uVar18;
        if (0xfff < uVar18) {
          memset(puVar1 + iVar6,0xff,(ulong)(uVar18 - 0xfff) << 2);
          uVar11 = (ulong)((iVar6 + uVar18) - 0xfff);
          uVar8 = 0xfff;
        }
        bVar22 = false;
        if (uVar8 != 0) {
          iVar6 = (int)uVar11;
          if (0xffe < uVar18) {
            uVar18 = 0xfff;
          }
          uVar8 = uVar21 * 0x5bd1e996 + uVar8 * -0x395b586d;
          lVar16 = 0;
          do {
            puVar1[iVar6 + lVar16] = *(uint32_t *)((long)__s + (ulong)(uVar8 >> 0xe) * 4);
            *(int *)((long)__s + (ulong)(uVar8 >> 0xe) * 4) = iVar6 + (int)lVar16;
            lVar16 = lVar16 + 1;
            uVar8 = uVar8 + 0x395b586d;
          } while (uVar18 != (uint)lVar16);
          uVar11 = (ulong)(iVar6 + (uint)lVar16);
        }
      }
      else {
        bVar22 = argb[(long)iVar6 + 1] == argb[(long)iVar6 + 2];
        uVar11 = (ulong)(iVar6 + 1);
        uVar15 = (ulong)(argb[iVar6] * 0x5bd1e996 + argb[(long)iVar6 + 1] * -0x395b586d >> 0xe);
        puVar1[iVar6] = *(uint32_t *)((long)__s + uVar15 * 4);
        *(int *)((long)__s + uVar15 * 4) = iVar6;
      }
    } while ((int)uVar11 < (int)uVar12);
    puVar1[uVar11] =
         *(uint32_t *)
          ((long)__s +
          (ulong)(argb[uVar11] * 0x5bd1e996 + argb[uVar11 + 1] * -0x395b586d >> 0xe) * 4);
    WebPSafeFree(__s);
    puVar2 = p->offset_length_;
    puVar2[iVar19 - 1U] = 0;
    *puVar2 = 0;
    if (uVar12 != 0) {
      iVar6 = uVar3 + 7;
      do {
        uVar3 = (uint)uVar13;
        iVar9 = (iVar19 - 1U) - uVar3;
        iVar5 = 0xfff;
        if (iVar9 < 0xfff) {
          iVar5 = iVar9;
        }
        uVar15 = 0;
        uVar11 = (ulong)(uVar3 - uVar7);
        if (uVar3 < uVar7) {
          uVar11 = uVar15;
        }
        if (0xff < iVar9) {
          iVar9 = 0x100;
        }
        puVar2 = argb + uVar13;
        uVar21 = puVar1[uVar13];
        iVar10 = (int)uVar11;
        if (low_effort == 0) {
          uVar11 = 0;
          uVar17 = 0;
          iVar20 = iVar4;
          uVar12 = 0;
          if ((uint)xsize <= uVar3) {
            uVar18 = 0;
            if (puVar2[-(ulong)(uint)xsize] == *puVar2) {
              uVar18 = (*VP8LVectorMismatch)(puVar2 + -(ulong)(uint)xsize,puVar2,iVar5);
            }
            uVar12 = uVar18;
            if ((int)uVar18 < 1) {
              uVar12 = 0;
            }
            uVar17 = (ulong)uVar12;
            iVar20 = iVar6;
            uVar12 = 0;
            if (0 < (int)uVar18) {
              uVar12 = xsize;
            }
          }
          if (puVar2[uVar17 - 1] == puVar2[uVar17]) {
            uVar18 = (*VP8LVectorMismatch)(puVar2 + -1,puVar2,iVar5);
            uVar11 = (ulong)uVar18;
          }
          uVar15 = uVar17;
          if ((int)uVar17 < (int)uVar11) {
            uVar15 = uVar11;
          }
          if ((int)uVar17 < (int)uVar11) {
            uVar12 = 1;
          }
          iVar20 = iVar20 + -1;
          if ((int)uVar15 == 0xfff) {
            uVar21 = iVar10 - 1;
          }
        }
        else {
          uVar12 = 0;
          iVar20 = iVar4;
        }
        if (iVar10 <= (int)uVar21) {
          uVar14 = puVar2[uVar15];
          while (iVar20 = iVar20 + -1, iVar20 != 0) {
            if (argb[(int)(uVar21 + (int)uVar15)] == uVar14) {
              uVar18 = (*VP8LVectorMismatch)(argb + (int)uVar21,puVar2,iVar5);
              if ((int)uVar15 < (int)uVar18) {
                uVar12 = uVar3 - uVar21;
                uVar14 = puVar2[uVar18];
                bVar22 = iVar9 <= (int)uVar18;
                uVar15 = (ulong)uVar18;
              }
              else {
                bVar22 = false;
              }
            }
            else {
              bVar22 = false;
            }
            if ((bVar22) || (uVar21 = puVar1[(int)uVar21], (int)uVar21 < iVar10)) break;
          }
        }
        puVar2 = p->offset_length_;
        uVar18 = uVar3 - 1;
        puVar2[uVar13] = (uint)uVar15 | uVar12 << 0xc;
        if (uVar12 == 0) {
          uVar11 = (ulong)uVar18;
        }
        else if ((uVar18 == 0) || (uVar18 < uVar12)) {
          uVar11 = (ulong)uVar18;
        }
        else {
          uVar3 = uVar3 - 2;
          do {
            uVar8 = uVar3;
            uVar11 = (ulong)(uVar8 + 1);
            if (argb[(uVar8 - uVar12) + 1] != argb[uVar11]) {
              uVar11 = (ulong)uVar18;
              goto LAB_00148d31;
            }
            iVar5 = (int)uVar15;
            if (((uVar12 != 1) && (iVar5 == 0xfff)) && (uVar8 + 0x1000 < (uint)uVar13))
            goto LAB_00148d31;
            if (iVar5 < 0xfff) {
              uVar13 = uVar11;
            }
            uVar3 = iVar5 + (uint)(iVar5 < 0xfff);
            uVar15 = (ulong)uVar3;
            puVar2[uVar8 + 1] = uVar3 | uVar12 << 0xc;
          } while (((uVar12 != 0) && (uVar8 != 0)) &&
                  (uVar18 = uVar18 - 1, uVar3 = uVar8 - 1, uVar12 <= uVar8));
          uVar11 = (ulong)uVar8;
        }
LAB_00148d31:
        uVar13 = uVar11;
      } while ((int)uVar13 != 0);
    }
  }
  return 1;
}

Assistant:

int VP8LHashChainFill(VP8LHashChain* const p, int quality,
                      const uint32_t* const argb, int xsize, int ysize,
                      int low_effort) {
  const int size = xsize * ysize;
  const int iter_max = GetMaxItersForQuality(quality);
  const uint32_t window_size = GetWindowSizeForHashChain(quality, xsize);
  int pos;
  int argb_comp;
  uint32_t base_position;
  int32_t* hash_to_first_index;
  // Temporarily use the p->offset_length_ as a hash chain.
  int32_t* chain = (int32_t*)p->offset_length_;
  assert(size > 0);
  assert(p->size_ != 0);
  assert(p->offset_length_ != NULL);

  if (size <= 2) {
    p->offset_length_[0] = p->offset_length_[size - 1] = 0;
    return 1;
  }

  hash_to_first_index =
      (int32_t*)WebPSafeMalloc(HASH_SIZE, sizeof(*hash_to_first_index));
  if (hash_to_first_index == NULL) return 0;

  // Set the int32_t array to -1.
  memset(hash_to_first_index, 0xff, HASH_SIZE * sizeof(*hash_to_first_index));
  // Fill the chain linking pixels with the same hash.
  argb_comp = (argb[0] == argb[1]);
  for (pos = 0; pos < size - 2;) {
    uint32_t hash_code;
    const int argb_comp_next = (argb[pos + 1] == argb[pos + 2]);
    if (argb_comp && argb_comp_next) {
      // Consecutive pixels with the same color will share the same hash.
      // We therefore use a different hash: the color and its repetition
      // length.
      uint32_t tmp[2];
      uint32_t len = 1;
      tmp[0] = argb[pos];
      // Figure out how far the pixels are the same.
      // The last pixel has a different 64 bit hash, as its next pixel does
      // not have the same color, so we just need to get to the last pixel equal
      // to its follower.
      while (pos + (int)len + 2 < size && argb[pos + len + 2] == argb[pos]) {
        ++len;
      }
      if (len > MAX_LENGTH) {
        // Skip the pixels that match for distance=1 and length>MAX_LENGTH
        // because they are linked to their predecessor and we automatically
        // check that in the main for loop below. Skipping means setting no
        // predecessor in the chain, hence -1.
        memset(chain + pos, 0xff, (len - MAX_LENGTH) * sizeof(*chain));
        pos += len - MAX_LENGTH;
        len = MAX_LENGTH;
      }
      // Process the rest of the hash chain.
      while (len) {
        tmp[1] = len--;
        hash_code = GetPixPairHash64(tmp);
        chain[pos] = hash_to_first_index[hash_code];
        hash_to_first_index[hash_code] = pos++;
      }
      argb_comp = 0;
    } else {
      // Just move one pixel forward.
      hash_code = GetPixPairHash64(argb + pos);
      chain[pos] = hash_to_first_index[hash_code];
      hash_to_first_index[hash_code] = pos++;
      argb_comp = argb_comp_next;
    }
  }
  // Process the penultimate pixel.
  chain[pos] = hash_to_first_index[GetPixPairHash64(argb + pos)];

  WebPSafeFree(hash_to_first_index);

  // Find the best match interval at each pixel, defined by an offset to the
  // pixel and a length. The right-most pixel cannot match anything to the right
  // (hence a best length of 0) and the left-most pixel nothing to the left
  // (hence an offset of 0).
  assert(size > 2);
  p->offset_length_[0] = p->offset_length_[size - 1] = 0;
  for (base_position = size - 2; base_position > 0;) {
    const int max_len = MaxFindCopyLength(size - 1 - base_position);
    const uint32_t* const argb_start = argb + base_position;
    int iter = iter_max;
    int best_length = 0;
    uint32_t best_distance = 0;
    uint32_t best_argb;
    const int min_pos =
        (base_position > window_size) ? base_position - window_size : 0;
    const int length_max = (max_len < 256) ? max_len : 256;
    uint32_t max_base_position;

    pos = chain[base_position];
    if (!low_effort) {
      int curr_length;
      // Heuristic: use the comparison with the above line as an initialization.
      if (base_position >= (uint32_t)xsize) {
        curr_length = FindMatchLength(argb_start - xsize, argb_start,
                                      best_length, max_len);
        if (curr_length > best_length) {
          best_length = curr_length;
          best_distance = xsize;
        }
        --iter;
      }
      // Heuristic: compare to the previous pixel.
      curr_length =
          FindMatchLength(argb_start - 1, argb_start, best_length, max_len);
      if (curr_length > best_length) {
        best_length = curr_length;
        best_distance = 1;
      }
      --iter;
      // Skip the for loop if we already have the maximum.
      if (best_length == MAX_LENGTH) pos = min_pos - 1;
    }
    best_argb = argb_start[best_length];

    for (; pos >= min_pos && --iter; pos = chain[pos]) {
      int curr_length;
      assert(base_position > (uint32_t)pos);

      if (argb[pos + best_length] != best_argb) continue;

      curr_length = VP8LVectorMismatch(argb + pos, argb_start, max_len);
      if (best_length < curr_length) {
        best_length = curr_length;
        best_distance = base_position - pos;
        best_argb = argb_start[best_length];
        // Stop if we have reached a good enough length.
        if (best_length >= length_max) break;
      }
    }
    // We have the best match but in case the two intervals continue matching
    // to the left, we have the best matches for the left-extended pixels.
    max_base_position = base_position;
    while (1) {
      assert(best_length <= MAX_LENGTH);
      assert(best_distance <= WINDOW_SIZE);
      p->offset_length_[base_position] =
          (best_distance << MAX_LENGTH_BITS) | (uint32_t)best_length;
      --base_position;
      // Stop if we don't have a match or if we are out of bounds.
      if (best_distance == 0 || base_position == 0) break;
      // Stop if we cannot extend the matching intervals to the left.
      if (base_position < best_distance ||
          argb[base_position - best_distance] != argb[base_position]) {
        break;
      }
      // Stop if we are matching at its limit because there could be a closer
      // matching interval with the same maximum length. Then again, if the
      // matching interval is as close as possible (best_distance == 1), we will
      // never find anything better so let's continue.
      if (best_length == MAX_LENGTH && best_distance != 1 &&
          base_position + MAX_LENGTH < max_base_position) {
        break;
      }
      if (best_length < MAX_LENGTH) {
        ++best_length;
        max_base_position = base_position;
      }
    }
  }
  return 1;
}